

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow29_00000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double factor;
  Index in_stack_fffffffffffffef8;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_ffffffffffffff00;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0x98ca80);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98caa1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cace);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cafc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cb20);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar18,auVar32);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cb76);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cb9a);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *pSVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar19,auVar33);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cbf0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cc14);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pSVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar20,auVar34);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cc6a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cc8e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pSVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar21,auVar35);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cce4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cd08);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pSVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar22,auVar36);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cd5e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cd82);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar23,auVar37);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cdd8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cdfc);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pSVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar24,auVar38);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98ce55);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98ce7c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pSVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar25,auVar39);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cedb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cf02);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pSVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar26,auVar40);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cf61);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cf88);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *pSVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar27,auVar41);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98cfe7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d00e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *pSVar2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar28,auVar42);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d06d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d094);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pSVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar29,auVar43);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d0f3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d11a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pSVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar30,auVar44);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d179);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffef8,0x98d1a0);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pSVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar31,auVar45);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow29_00000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,65) / groebnerMatrix(29,65);
  groebnerMatrix(targetRow,65) = 0.0;
  groebnerMatrix(targetRow,66) -= factor * groebnerMatrix(29,66);
  groebnerMatrix(targetRow,67) -= factor * groebnerMatrix(29,67);
  groebnerMatrix(targetRow,68) -= factor * groebnerMatrix(29,68);
  groebnerMatrix(targetRow,69) -= factor * groebnerMatrix(29,69);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(29,70);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(29,71);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(29,72);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(29,73);
  groebnerMatrix(targetRow,74) -= factor * groebnerMatrix(29,74);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(29,75);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(29,76);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(29,77);
  groebnerMatrix(targetRow,78) -= factor * groebnerMatrix(29,78);
  groebnerMatrix(targetRow,79) -= factor * groebnerMatrix(29,79);
}